

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::Shape::Shape(Shape *this,SP *material)

{
  Entity *in_RSI;
  undefined8 *in_RDI;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffffd8;
  
  Entity::Entity(in_RSI);
  *in_RDI = &PTR___cxa_pure_virtual_0029c148;
  std::shared_ptr<pbrt::Material>::shared_ptr
            ((shared_ptr<pbrt::Material> *)in_RSI,in_stack_ffffffffffffffd8);
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0x3f800000;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::Texture>_>_>_>
         *)0x1e3622);
  std::shared_ptr<pbrt::AreaLight>::shared_ptr((shared_ptr<pbrt::AreaLight> *)0x1e3630);
  return;
}

Assistant:

Shape(Material::SP material = Material::SP()) : material(material) {}